

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O0

void __thiscall
JsrtDebugManager::ReportScriptCompile
          (JsrtDebugManager *this,JavascriptFunction *scriptFunction,Utf8SourceInfo *utf8SourceInfo,
          CompileScriptException *compileException)

{
  BSTR pWVar1;
  code *pcVar2;
  bool bVar3;
  UINT UVar4;
  DynamicObject *pDVar5;
  undefined4 *puVar6;
  HeapAllocator *alloc;
  DebugDocument *this_00;
  FunctionBody *functionBody;
  TrackAllocData local_a0;
  DebugDocument *local_78;
  DebugDocument *debugDocument;
  JsrtDebugDocumentManager *debugDocumentManager;
  JsrtDebugPropertyId local_60;
  JsrtDebugPropertyId local_5c;
  JsDiagDebugEvent local_58;
  JsDiagDebugEvent jsDiagDebugEvent;
  DynamicObject *local_48;
  DynamicObject *eventDataObject;
  JsrtDebugEventObject debugEventObject;
  ScriptContext *scriptContext;
  CompileScriptException *compileException_local;
  Utf8SourceInfo *utf8SourceInfo_local;
  JavascriptFunction *scriptFunction_local;
  JsrtDebugManager *this_local;
  
  if (this->debugEventCallback != (JsDiagDebugEventCallback)0x0) {
    debugEventObject.scriptContext = Js::Utf8SourceInfo::GetScriptContext(utf8SourceInfo);
    JsrtDebugEventObject::JsrtDebugEventObject
              ((JsrtDebugEventObject *)&eventDataObject,debugEventObject.scriptContext);
    pDVar5 = JsrtDebugEventObject::GetEventDataObject((JsrtDebugEventObject *)&eventDataObject);
    local_58 = JsDiagDebugEventCompileError;
    local_48 = pDVar5;
    if (scriptFunction == (JavascriptFunction *)0x0) {
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_5c,error);
      pWVar1 = (compileException->super_ScriptException).ei.bstrDescription;
      UVar4 = SysStringLen(pWVar1);
      JsrtDebugUtils::AddPropertyToObject
                (pDVar5,local_5c,pWVar1,(ulong)UVar4,debugEventObject.scriptContext);
      pDVar5 = local_48;
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_60,line);
      JsrtDebugUtils::AddPropertyToObject
                (pDVar5,local_60,compileException->line,debugEventObject.scriptContext);
      pDVar5 = local_48;
      JsrtDebugPropertyId::JsrtDebugPropertyId
                ((JsrtDebugPropertyId *)((long)&debugDocumentManager + 4),column);
      JsrtDebugUtils::AddPropertyToObject
                (pDVar5,debugDocumentManager._4_4_,
                 ~compileException->ichMinLine + (compileException->super_ScriptException).ichMin,
                 debugEventObject.scriptContext);
      pDVar5 = local_48;
      JsrtDebugPropertyId::JsrtDebugPropertyId
                ((JsrtDebugPropertyId *)&debugDocumentManager,sourceText);
      pWVar1 = compileException->bstrLine;
      UVar4 = SysStringLen(pWVar1);
      JsrtDebugUtils::AddPropertyToObject
                (pDVar5,debugDocumentManager._0_4_,pWVar1,(ulong)UVar4,
                 debugEventObject.scriptContext);
    }
    else {
      debugDocument = (DebugDocument *)GetDebugDocumentManager(this);
      if (debugDocument == (DebugDocument *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                           ,0xe9,"(debugDocumentManager != nullptr)",
                           "debugDocumentManager != nullptr");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_a0,(type_info *)&Js::DebugDocument::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                 ,0xec);
      alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_a0);
      this_00 = (DebugDocument *)new<Memory::HeapAllocator>(0x20,alloc,true,0x469be0);
      functionBody = Js::JavascriptFunction::GetFunctionBody(scriptFunction);
      Js::DebugDocument::DebugDocument(this_00,utf8SourceInfo,functionBody);
      local_78 = this_00;
      if (this_00 != (DebugDocument *)0x0) {
        Js::Utf8SourceInfo::SetDebugDocument(utf8SourceInfo,this_00);
      }
      local_58 = JsDiagDebugEventSourceCompile;
    }
    JsrtDebugUtils::AddSourceMetadataToObject(local_48,utf8SourceInfo);
    CallDebugEventCallback(this,local_58,local_48,debugEventObject.scriptContext,false);
    JsrtDebugEventObject::~JsrtDebugEventObject((JsrtDebugEventObject *)&eventDataObject);
  }
  return;
}

Assistant:

void JsrtDebugManager::ReportScriptCompile(Js::JavascriptFunction* scriptFunction, Js::Utf8SourceInfo* utf8SourceInfo, CompileScriptException* compileException)
{
    if (this->debugEventCallback != nullptr)
    {
        Js::ScriptContext* scriptContext = utf8SourceInfo->GetScriptContext();

        JsrtDebugEventObject debugEventObject(scriptContext);
        Js::DynamicObject* eventDataObject = debugEventObject.GetEventDataObject();

        JsDiagDebugEvent jsDiagDebugEvent = JsDiagDebugEventCompileError;

        if (scriptFunction == nullptr)
        {
            // Report JsDiagDebugEventCompileError event
            JsrtDebugUtils::AddPropertyToObject(eventDataObject, JsrtDebugPropertyId::error, compileException->ei.bstrDescription, ::SysStringLen(compileException->ei.bstrDescription), scriptContext);
            JsrtDebugUtils::AddPropertyToObject(eventDataObject, JsrtDebugPropertyId::line, compileException->line, scriptContext);
            JsrtDebugUtils::AddPropertyToObject(eventDataObject, JsrtDebugPropertyId::column, compileException->ichMin - compileException->ichMinLine - 1, scriptContext); // Converted to 0-based
            JsrtDebugUtils::AddPropertyToObject(eventDataObject, JsrtDebugPropertyId::sourceText, compileException->bstrLine, ::SysStringLen(compileException->bstrLine), scriptContext);
        }
        else
        {
            JsrtDebugDocumentManager* debugDocumentManager = this->GetDebugDocumentManager();
            Assert(debugDocumentManager != nullptr);

            // Create DebugDocument and then report JsDiagDebugEventSourceCompile event
            Js::DebugDocument* debugDocument = HeapNewNoThrow(Js::DebugDocument, utf8SourceInfo, scriptFunction->GetFunctionBody());
            if (debugDocument != nullptr)
            {
                utf8SourceInfo->SetDebugDocument(debugDocument);
            }

            jsDiagDebugEvent = JsDiagDebugEventSourceCompile;
        }

        JsrtDebugUtils::AddSourceMetadataToObject(eventDataObject, utf8SourceInfo);

        this->CallDebugEventCallback(jsDiagDebugEvent, eventDataObject, scriptContext, false /*isBreak*/);
    }
}